

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.c
# Opt level: O0

int x509_name_ex_print(BIO *out,ASN1_VALUE **pval,int indent,char *fname,ASN1_PCTX *pctx)

{
  int iVar1;
  int in_EDX;
  undefined8 *in_RSI;
  BIO *in_RDI;
  long in_R8;
  undefined4 local_4;
  
  iVar1 = X509_NAME_print_ex(in_RDI,(X509_NAME *)*in_RSI,in_EDX,*(ulong *)(in_R8 + 8));
  if (iVar1 < 1) {
    local_4 = 0;
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static int x509_name_ex_print(BIO *out, const ASN1_VALUE **pval,
                              int indent,
                              const char *fname, const ASN1_PCTX *pctx)
{
    if (X509_NAME_print_ex(out, (const X509_NAME *)*pval,
                           indent, pctx->nm_flags) <= 0)
        return 0;
    return 2;
}